

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::uniform_dist<double>::icdf(uniform_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    rVar2 = param_type::d(in_RDI);
    rVar3 = param_type::a(in_RDI);
    local_8 = in_XMM0_Qa * rVar2 + rVar3;
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x * P.d() + P.a();
    }